

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_512f7::DiskInterfaceTestStatBadPath::Run(DiskInterfaceTestStatBadPath *this)

{
  Test *pTVar1;
  bool condition;
  TimeStamp TVar2;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string too_long_name;
  string err;
  DiskInterfaceTestStatBadPath *this_local;
  
  std::__cxx11::string::string((string *)(too_long_name.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,0x200,'x',&local_51);
  std::allocator<char>::~allocator(&local_51);
  pTVar1 = g_current_test;
  TVar2 = RealDiskInterface::Stat
                    (&(this->super_DiskInterfaceTest).disk_,(string *)local_50,
                     (string *)((long)&too_long_name.field_2 + 8));
  testing::Test::Check
            (pTVar1,TVar2 == -1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
             ,0x4c,"-1 == disk_.Stat(too_long_name, &err)");
  pTVar1 = g_current_test;
  condition = std::operator!=("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&too_long_name.field_2 + 8));
  testing::Test::Check
            (pTVar1,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
             ,0x4d,"\"\" != err");
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(too_long_name.field_2._M_local_buf + 8));
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, StatBadPath) {
  string err;
#ifdef _WIN32
  string bad_path("cc:\\foo");
  EXPECT_EQ(-1, disk_.Stat(bad_path, &err));
  EXPECT_NE("", err);
#else
  string too_long_name(512, 'x');
  EXPECT_EQ(-1, disk_.Stat(too_long_name, &err));
  EXPECT_NE("", err);
#endif
}